

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeReader.cpp
# Opt level: O1

byte * __thiscall
Js::ByteCodeReader::SetCurrentRelativeOffset(ByteCodeReader *this,byte *ip,int byteOffset)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  byte *pbVar4;
  
  if (this->m_endLocation <= ip) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeReader.cpp"
                                ,0xdd,"(ip < m_endLocation)","ip < m_endLocation");
    if (!bVar2) goto LAB_00878e63;
    *puVar3 = 0;
  }
  pbVar4 = ip + byteOffset;
  if (this->m_endLocation <= pbVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeReader.cpp"
                                ,0xdf,"(targetip < m_endLocation)","targetip < m_endLocation");
    if (!bVar2) {
LAB_00878e63:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  this->m_currentLocation = pbVar4;
  return pbVar4;
}

Assistant:

const byte * ByteCodeReader::SetCurrentRelativeOffset(const byte * ip, int byteOffset)
    {
        Assert(ip < m_endLocation);
        const byte * targetip = ip + byteOffset;
        Assert(targetip < m_endLocation);
        m_currentLocation = targetip;
        return targetip;
    }